

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

AWeapon * __thiscall FWeaponSlot::PickWeapon(FWeaponSlot *this,player_t *player,bool checkammo)

{
  PClassWeapon *pPVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  uint uVar4;
  WeaponInfo *pWVar5;
  MetaClass *pMVar6;
  AWeapon *pAVar7;
  uint local_74;
  uint local_64;
  AWeapon *weap_1;
  AWeapon *weap;
  uint local_28;
  int j;
  int i;
  bool checkammo_local;
  player_t *player_local;
  FWeaponSlot *this_local;
  
  if (player->mo == (APlayerPawn *)0x0) {
    this_local = (FWeaponSlot *)0x0;
  }
  else {
    uVar4 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Size(&this->Weapons);
    if (uVar4 == 0) {
      this_local = (FWeaponSlot *)player->ReadyWeapon;
    }
    else {
      if (player->ReadyWeapon != (AWeapon *)0x0) {
        for (local_28 = 0;
            uVar4 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Size(&this->Weapons),
            local_28 < uVar4; local_28 = local_28 + 1) {
          pWVar5 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                             (&this->Weapons,(long)(int)local_28);
          pPVar1 = pWVar5->Type;
          pMVar6 = AWeapon::GetClass(player->ReadyWeapon);
          if (pPVar1 == pMVar6) {
LAB_00698bc7:
            local_64 = local_28;
            if (local_28 == 0) {
              local_64 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Size
                                   (&this->Weapons);
            }
            local_64 = local_64 - 1;
            weap._4_4_ = local_64;
            while (weap._4_4_ != local_28) {
              pAVar2 = player->mo;
              pWVar5 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                                 (&this->Weapons,(long)(int)weap._4_4_);
              pAVar7 = (AWeapon *)
                       AActor::FindInventory
                                 (&pAVar2->super_AActor,(PClassActor *)pWVar5->Type,false);
              if ((pAVar7 != (AWeapon *)0x0) &&
                 (bVar3 = DObject::IsKindOf((DObject *)pAVar7,AWeapon::RegistrationInfo.MyClass),
                 bVar3)) {
                if (!checkammo) {
                  return pAVar7;
                }
                bVar3 = AWeapon::CheckAmmo(pAVar7,2,false,false,-1);
                if (bVar3) {
                  return pAVar7;
                }
              }
              if (weap._4_4_ == 0) {
                weap._4_4_ = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Size
                                       (&this->Weapons);
              }
              local_74 = weap._4_4_ - 1;
              weap._4_4_ = local_74;
            }
          }
          else if (((*(uint *)&(player->ReadyWeapon->super_AStateProvider).super_AInventory.
                               field_0x4fc & 0x400) != 0) &&
                  (bVar3 = TObjPtr<AWeapon>::operator!=
                                     (&player->ReadyWeapon->SisterWeapon,(AWeapon *)0x0), bVar3)) {
            pAVar7 = TObjPtr<AWeapon>::operator->(&player->ReadyWeapon->SisterWeapon);
            pMVar6 = AWeapon::GetClass(pAVar7);
            pWVar5 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                               (&this->Weapons,(long)(int)local_28);
            if (pMVar6 == pWVar5->Type) goto LAB_00698bc7;
          }
        }
      }
      local_28 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Size(&this->Weapons);
      while (local_28 = local_28 - 1, -1 < (int)local_28) {
        pAVar2 = player->mo;
        pWVar5 = TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator[]
                           (&this->Weapons,(long)(int)local_28);
        pAVar7 = (AWeapon *)
                 AActor::FindInventory(&pAVar2->super_AActor,(PClassActor *)pWVar5->Type,false);
        if ((pAVar7 != (AWeapon *)0x0) &&
           (bVar3 = DObject::IsKindOf((DObject *)pAVar7,AWeapon::RegistrationInfo.MyClass), bVar3))
        {
          if (!checkammo) {
            return pAVar7;
          }
          bVar3 = AWeapon::CheckAmmo(pAVar7,2,false,false,-1);
          if (bVar3) {
            return pAVar7;
          }
        }
      }
      this_local = (FWeaponSlot *)player->ReadyWeapon;
    }
  }
  return (AWeapon *)this_local;
}

Assistant:

AWeapon *FWeaponSlot::PickWeapon(player_t *player, bool checkammo)
{
	int i, j;

	if (player->mo == NULL)
	{
		return NULL;
	}
	// Does this slot even have any weapons?
	if (Weapons.Size() == 0)
	{
		return player->ReadyWeapon;
	}
	if (player->ReadyWeapon != NULL)
	{
		for (i = 0; (unsigned)i < Weapons.Size(); i++)
		{
			if (Weapons[i].Type == player->ReadyWeapon->GetClass() ||
				(player->ReadyWeapon->WeaponFlags & WIF_POWERED_UP &&
				 player->ReadyWeapon->SisterWeapon != NULL &&
				 player->ReadyWeapon->SisterWeapon->GetClass() == Weapons[i].Type))
			{
				for (j = (i == 0 ? Weapons.Size() - 1 : i - 1);
					j != i;
					j = (j == 0 ? Weapons.Size() - 1 : j - 1))
				{
					AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[j].Type));

					if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
						{
							return weap;
						}
					}
				}
			}
		}
	}
	for (i = Weapons.Size() - 1; i >= 0; i--)
	{
		AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[i].Type));

		if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
		{
			if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
	}
	return player->ReadyWeapon;
}